

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::calcNullable(RBBITableBuilder *this,RBBINode *n)

{
  NodeType NVar1;
  UBool UVar2;
  
  if (n == (RBBINode *)0x0) {
    return;
  }
  NVar1 = n->fType;
  if ((NVar1 < opStart) && ((0x71U >> (NVar1 & 0x1f) & 1) != 0)) {
    UVar2 = (UBool)(0x10100000000 >> ((byte)(NVar1 << 3) & 0x3f));
    goto switchD_002b41c6_caseD_a;
  }
  calcNullable(this,n->fLeftChild);
  calcNullable(this,n->fRightChild);
  UVar2 = '\x01';
  switch(n->fType) {
  case opCat:
    if (n->fLeftChild->fNullable == '\0') goto switchD_002b41c6_caseD_b;
    break;
  case opOr:
    if (n->fLeftChild->fNullable != '\0') goto switchD_002b41c6_caseD_a;
    break;
  case opStar:
  case opQuestion:
    goto switchD_002b41c6_caseD_a;
  default:
switchD_002b41c6_caseD_b:
    UVar2 = '\0';
    goto switchD_002b41c6_caseD_a;
  }
  UVar2 = n->fRightChild->fNullable != '\0';
switchD_002b41c6_caseD_a:
  n->fNullable = UVar2;
  return;
}

Assistant:

void RBBITableBuilder::calcNullable(RBBINode *n) {
    if (n == NULL) {
        return;
    }
    if (n->fType == RBBINode::setRef ||
        n->fType == RBBINode::endMark ) {
        // These are non-empty leaf node types.
        n->fNullable = FALSE;
        return;
    }

    if (n->fType == RBBINode::lookAhead || n->fType == RBBINode::tag) {
        // Lookahead marker node.  It's a leaf, so no recursion on children.
        // It's nullable because it does not match any literal text from the input stream.
        n->fNullable = TRUE;
        return;
    }


    // The node is not a leaf.
    //  Calculate nullable on its children.
    calcNullable(n->fLeftChild);
    calcNullable(n->fRightChild);

    // Apply functions from table 3.40 in Aho
    if (n->fType == RBBINode::opOr) {
        n->fNullable = n->fLeftChild->fNullable || n->fRightChild->fNullable;
    }
    else if (n->fType == RBBINode::opCat) {
        n->fNullable = n->fLeftChild->fNullable && n->fRightChild->fNullable;
    }
    else if (n->fType == RBBINode::opStar || n->fType == RBBINode::opQuestion) {
        n->fNullable = TRUE;
    }
    else {
        n->fNullable = FALSE;
    }
}